

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hacl_Poly1305_64.c
# Opt level: O2

void Hacl_Poly1305_64_update_last
               (Hacl_Impl_Poly1305_64_State_poly1305_state st,uint8_t *m,uint32_t len1)

{
  if (len1 != 0) {
    Hacl_Impl_Poly1305_64_poly1305_process_last_block(st,m,(ulong)len1);
  }
  Hacl_Impl_Poly1305_64_poly1305_last_pass(st.h);
  return;
}

Assistant:

void
Hacl_Poly1305_64_update_last(
  Hacl_Impl_Poly1305_64_State_poly1305_state st,
  uint8_t *m,
  uint32_t len1
)
{
  if (!((uint64_t)len1 == (uint64_t)0U))
    Hacl_Impl_Poly1305_64_poly1305_process_last_block(st, m, (uint64_t)len1);
  Hacl_Impl_Poly1305_64_State_poly1305_state scrut = st;
  uint64_t *h = scrut.h;
  uint64_t *acc = h;
  Hacl_Impl_Poly1305_64_poly1305_last_pass(acc);
}